

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::RedeferFunction(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int iVar5;
  Attributes AVar6;
  undefined4 *puVar7;
  ScriptContext *this_00;
  ByteBlock **ppBVar8;
  ByteBlock *pBVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParseableFunctionInfo *proxy;
  FunctionInfo *this_01;
  Utf8SourceInfo *this_02;
  char16_t *local_50;
  FunctionInfo *functionInfo;
  ParseableFunctionInfo *parseableFunctionInfo;
  ThreadContext *local_18;
  ThreadContext *threadContext;
  FunctionBody *this_local;
  
  threadContext = (ThreadContext *)this;
  bVar2 = FunctionProxy::CanBeDeferred((FunctionProxy *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x3bc,"(this->CanBeDeferred())","this->CanBeDeferred()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,RedeferralPhase,uVar3,LVar4);
  if (bVar2) {
    this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
    local_18 = ScriptContext::GetThreadContext(this_00);
    local_18->redeferredFunctions = local_18->redeferredFunctions + 1;
    uVar3 = GetInlineCacheCount(this);
    local_18->recoveredBytes = local_18->recoveredBytes + uVar3 * 0x20 + 0x1e8;
    ppBVar8 = Memory::WriteBarrierPtr::operator_cast_to_ByteBlock__
                        ((WriteBarrierPtr *)&this->byteCodeBlock);
    if (*ppBVar8 != (ByteBlock *)0x0) {
      pBVar9 = Memory::WriteBarrierPtr<Js::ByteBlock>::operator->(&this->byteCodeBlock);
      uVar3 = ByteBlock::GetLength(pBVar9);
      local_18->recoveredBytes = uVar3 + local_18->recoveredBytes;
      pBVar9 = GetAuxiliaryData(this);
      if (pBVar9 != (ByteBlock *)0x0) {
        pBVar9 = GetAuxiliaryData(this);
        uVar3 = ByteBlock::GetLength(pBVar9);
        local_18->recoveredBytes = uVar3 + local_18->recoveredBytes;
      }
    }
    MapEntryPoints<Js::FunctionBody::RedeferFunction()::__0>
              (this,(anon_class_8_1_312e1e65)&local_18);
  }
  UnlockCounters(this);
  uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,RedeferralPhase,uVar3,LVar4);
  if (bVar2) {
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    iVar5 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    if (CONCAT44(extraout_var,iVar5) == 0) {
      local_50 = L"Anonymous function)";
    }
    else {
      iVar5 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      local_50 = (char16_t *)CONCAT44(extraout_var_00,iVar5);
    }
    Output::Print(L"Redeferring function %d.%d: %s\n",(ulong)uVar3,(ulong)LVar4,local_50);
    Output::Flush();
  }
  proxy = ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
  this_01 = FunctionProxy::GetFunctionInfo((FunctionProxy *)this);
  RedeferFunctionObjectTypes(this);
  Cleanup(this,false);
  bVar2 = GetIsFuncRegistered(this);
  if (bVar2) {
    this_02 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
    Utf8SourceInfo::RemoveFunctionBody(this_02,this);
  }
  AVar6 = FunctionInfo::GetAttributes(this_01);
  FunctionInfo::SetAttributes(this_01,AVar6 | DeferredParse);
  FunctionInfo::SetFunctionProxy(this_01,&proxy->super_FunctionProxy);
  FunctionInfo::SetOriginalEntryPoint(this_01,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  return;
}

Assistant:

void FunctionBody::RedeferFunction()
    {
        Assert(this->CanBeDeferred());

#if DBG
        if (PHASE_STATS(RedeferralPhase, this))
        {
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            threadContext->redeferredFunctions++;
            threadContext->recoveredBytes += sizeof(*this) + this->GetInlineCacheCount() * sizeof(InlineCache);
            if (this->byteCodeBlock)
            {
                threadContext->recoveredBytes += this->byteCodeBlock->GetLength();
                if (this->GetAuxiliaryData())
                {
                    threadContext->recoveredBytes += this->GetAuxiliaryData()->GetLength();
                }
            }
            this->MapEntryPoints([&](int index, FunctionEntryPointInfo * info) {
                threadContext->recoveredBytes += sizeof(info);
            });

            // TODO: Get size of polymorphic caches, jitted code, etc.
        }

        // We can't get here if the function is being jitted. Jitting was either completed or not begun.
        this->UnlockCounters();
#endif

        PHASE_PRINT_TRACE(Js::RedeferralPhase, this, _u("Redeferring function %d.%d: %s\n"),
                          GetSourceContextId(), GetLocalFunctionId(),
                          GetDisplayName() ? GetDisplayName() : _u("Anonymous function)"));

        ParseableFunctionInfo * parseableFunctionInfo =
            Js::ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
        FunctionInfo * functionInfo = this->GetFunctionInfo();

        this->RedeferFunctionObjectTypes();

        this->Cleanup(false);

        if (GetIsFuncRegistered())
        {
            this->GetUtf8SourceInfo()->RemoveFunctionBody(this);
        }

        // New allocation is done at this point, so update existing structures
        // Adjust functionInfo attributes, point to new proxy
        functionInfo->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
        functionInfo->SetFunctionProxy(parseableFunctionInfo);
        functionInfo->SetOriginalEntryPoint(DefaultEntryThunk);
    }